

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

size_t M_GetPos(Matrix *M,size_t RoC,size_t Entry)

{
  LASErrIdType LVar1;
  size_t local_28;
  size_t Pos;
  size_t Entry_local;
  size_t RoC_local;
  Matrix *M_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if ((((M->ElOrder == Rowws) && (RoC != 0)) && (RoC <= M->RowDim)) ||
       (((M->ElOrder == Clmws && (RoC != 0)) && ((RoC <= M->ClmDim && (Entry < M->Len[RoC])))))) {
      local_28 = M->El[RoC][Entry].Pos;
    }
    else {
      LASError(LASRangeErr,"M_GetPos",M->Name,(char *)0x0,(char *)0x0);
      local_28 = 0;
    }
  }
  else {
    local_28 = 0;
  }
  return local_28;
}

Assistant:

size_t M_GetPos(Matrix *M, size_t RoC, size_t Entry)
/* returns the position of a matrix entry */
{
    size_t Pos;

    if (LASResult() == LASOK)
        if ((M->ElOrder == Rowws && RoC > 0 && RoC <= M->RowDim) ||
            ((M->ElOrder == Clmws && RoC > 0 && RoC <= M->ClmDim) &&
            (Entry < M->Len[RoC]))) {
            Pos = M->El[RoC][Entry].Pos;
        } else {
            LASError(LASRangeErr, "M_GetPos", M->Name, NULL, NULL);
	    Pos = 0;
        }
    else
        Pos = 0;
    return(Pos);
}